

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macierz.c
# Opt level: O2

int main(void)

{
  double dVar1;
  void *__ptr;
  void *__ptr_00;
  int *piVar2;
  runnable_t *prVar3;
  ulong uVar4;
  int i;
  undefined4 uVar5;
  long lVar6;
  int i_2;
  undefined4 uVar7;
  undefined1 local_c0 [8];
  thread_pool_t pool;
  int columns;
  int rows;
  
  pthread_mutex_init((pthread_mutex_t *)&guard,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&cond,(pthread_condattr_t *)0x0);
  __isoc99_scanf("%d",(undefined1 *)((long)&pool.threads_idle + 0x2c));
  __isoc99_scanf("%d",(undefined1 *)((long)&pool.threads_idle + 0x28));
  thread_pool_init((thread_pool_t *)local_c0,4);
  uVar5 = pool.threads_idle.__data.__g_signals[1];
  row_sum = (int *)calloc((long)(int)pool.threads_idle.__data.__g_signals[1],4);
  uVar7 = pool.threads_idle.__data.__g_signals[0];
  lVar6 = (long)(int)(uVar5 * pool.threads_idle.__data.__g_signals[0]);
  __ptr = malloc(lVar6 * 8);
  __ptr_00 = malloc(lVar6 * 0x18);
  for (lVar6 = 0; lVar6 < (int)(uVar5 * uVar7); lVar6 = lVar6 + 1) {
    piVar2 = (int *)malloc(0xc);
    dVar1 = floor((double)(int)lVar6 / (double)(int)uVar7);
    *piVar2 = (int)dVar1;
    __isoc99_scanf("%d",piVar2 + 1);
    __isoc99_scanf("%d",piVar2 + 2);
    *(int **)((long)__ptr + lVar6 * 8) = piVar2;
    prVar3 = (runnable_t *)malloc(0x18);
    prVar3->function = runnable_function;
    prVar3->arg = piVar2;
    prVar3->argsz = 0xc;
    *(runnable_t **)((long)__ptr_00 + lVar6 * 8) = prVar3;
    defer((thread_pool_t *)local_c0,*prVar3);
    uVar5 = pool.threads_idle.__data.__g_signals[1];
    uVar7 = pool.threads_idle.__data.__g_signals[0];
  }
  pthread_mutex_lock((pthread_mutex_t *)&guard);
  while (count != pool.threads_idle.__data.__g_signals[0] * pool.threads_idle.__data.__g_signals[1])
  {
    pthread_cond_wait((pthread_cond_t *)&cond,(pthread_mutex_t *)&guard);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&guard);
  thread_pool_destroy((thread_pool_t *)local_c0);
  for (lVar6 = 0; uVar4 = (ulong)(int)pool.threads_idle.__data.__g_signals[1], lVar6 < (long)uVar4;
      lVar6 = lVar6 + 1) {
    printf("%d\n",(ulong)(uint)row_sum[lVar6]);
  }
  for (lVar6 = 0; lVar6 < (long)(int)uVar4 * (long)(int)pool.threads_idle.__data.__g_signals[0];
      lVar6 = lVar6 + 1) {
    free(*(void **)((long)__ptr + lVar6 * 8));
    free(*(void **)((long)__ptr_00 + lVar6 * 8));
    uVar4 = (ulong)pool.threads_idle.__data.__g_signals[1];
  }
  free(__ptr);
  free(__ptr_00);
  free(row_sum);
  return 0;
}

Assistant:

int main() {
    pthread_mutex_init(&guard, 0);
    pthread_cond_init(&cond, 0);

    int rows, columns;
    scanf("%d", &rows);
    scanf("%d", &columns);

    thread_pool_t pool;
    thread_pool_init(&pool, NO_THREADS);

    row_sum = calloc(rows, sizeof(int));

    my_job **jobArray = malloc(rows * columns * sizeof(my_job *));
    runnable_t **runArray = malloc(rows * columns * sizeof(runnable_t));
    for (int i = 0; i < rows * columns; ++i) {
        /* Creating Job */
        my_job *new_my_job = malloc(sizeof(my_job));

        new_my_job->row = floor((double) i / (double) columns);

        scanf("%d", &new_my_job->val);
        scanf("%d", &new_my_job->sleep_time);

        jobArray[i] = new_my_job;

        /* Creating Runnable */
        runnable_t *new_runnable = malloc(sizeof(runnable_t));

        new_runnable->function = runnable_function;
        new_runnable->arg = new_my_job;
        new_runnable->argsz = sizeof(my_job);

        runArray[i] = new_runnable;

        /* Submit task to the thread pool */
        defer(&pool, *new_runnable);
    }

    pthread_mutex_lock(&guard);
    while (count != rows * columns) {
        pthread_cond_wait(&cond, &guard);
    }
    pthread_mutex_unlock(&guard);

    thread_pool_destroy(&pool);

    for (int i = 0; i < rows; ++i) {
        printf("%d\n", row_sum[i]);
    }

    for (int i = 0; i < rows * columns; ++i) {
        free(jobArray[i]);
        free(runArray[i]);
    }

    free(jobArray);
    free(runArray);
    free(row_sum);

    return 0;
}